

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O1

nodetree * NodeTree_ChildByName(void *p,tchar_t *Name,fourcc_t Class,bool_t Recursive)

{
  bool_t bVar1;
  tchar_t *a;
  nodetree *pnVar2;
  nodetree *unaff_RBX;
  void *p_00;
  bool bVar3;
  
  if ((Name != (tchar_t *)0x0 && p != (void *)0x0) && (*Name != '\0')) {
    pnVar2 = *(nodetree **)((long)p + 0x30);
    while (pnVar2 != (nodetree *)0x0) {
      bVar1 = Node_IsPartOf(pnVar2,Class);
      if (bVar1 != 0) {
        a = (tchar_t *)Node_GetData(&pnVar2->Base,5,4);
        if ((a == (tchar_t *)0x0) || (bVar1 = tcsisame_ascii(a,Name), bVar1 == 0)) {
          bVar3 = true;
        }
        else {
          bVar3 = false;
          unaff_RBX = pnVar2;
        }
        if (!bVar3) {
          bVar3 = false;
          pnVar2 = unaff_RBX;
          goto LAB_0010fece;
        }
      }
      bVar3 = pnVar2 == pnVar2->Next;
      pnVar2 = pnVar2->Next;
      if (bVar3) {
        __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                      ,0x5b,
                      "nodetree *NodeTree_ChildByName(const void *, const tchar_t *, fourcc_t, bool_t)"
                     );
      }
    }
    if (Recursive == 0) {
      bVar3 = true;
      pnVar2 = unaff_RBX;
    }
    else {
      p_00 = *(void **)((long)p + 0x30);
      while ((bVar3 = p_00 == (void *)0x0, pnVar2 = unaff_RBX, !bVar3 &&
             (pnVar2 = NodeTree_ChildByName(p_00,Name,Class,1), pnVar2 == (nodetree *)0x0))) {
        bVar3 = p_00 == *(void **)((long)p_00 + 0x28);
        p_00 = *(void **)((long)p_00 + 0x28);
        if (bVar3) {
          __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                        ,0x66,
                        "nodetree *NodeTree_ChildByName(const void *, const tchar_t *, fourcc_t, bool_t)"
                       );
        }
      }
    }
LAB_0010fece:
    if (!bVar3) {
      return pnVar2;
    }
  }
  return (nodetree *)0x0;
}

Assistant:

nodetree* NodeTree_ChildByName(const void* p,const tchar_t* Name, fourcc_t Class, bool_t Recursive)
{
    if (p && Name && Name[0])
    {
        nodetree* i;
        for (i=NodeTree_Children(p);i;i=NodeTree_Next(i))
            if (Node_IsPartOf(i,Class))
            {
                const tchar_t* s = (const tchar_t*)Node_GetData((node*)i,NODE_ID,TYPE_STRING);
                if (s && tcsisame_ascii(s,Name))
                    return i;
            }

        if (Recursive)
        {
            nodetree* j;
            for (i=NodeTree_Children(p);i;i=NodeTree_Next(i))
                if ((j = NodeTree_ChildByName(i,Name,Class,1))!=NULL)
                    return j;
        }
    }
    return NULL;
}